

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int match_tzofs(date_parse_result *res,char **str,size_t *len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *acc;
  char **str_00;
  CVmTimeZone *pCVar4;
  char **in_RDX;
  long *in_RSI;
  long in_RDI;
  int32_t ofs;
  int ss;
  int mi;
  int hh;
  int s;
  int gmtlit;
  date_parse_string part;
  size_t rem;
  char *p;
  int32_t in_stack_00000084;
  CVmTimeZoneCache *in_stack_00000088;
  int local_4c;
  char *in_stack_ffffffffffffffc0;
  date_parse_string *in_stack_ffffffffffffffc8;
  char *lit;
  size_t *len_00;
  int local_4;
  
  len_00 = (size_t *)*in_RSI;
  lit = *in_RDX;
  date_parse_string::date_parse_string((date_parse_string *)&stack0xffffffffffffffc0);
  iVar1 = match_lit(in_RDX,len_00,lit,in_stack_ffffffffffffffc8);
  if ((lit == (char *)0x0) || (((char)*len_00 != '+' && ((char)*len_00 != '-')))) {
    local_4 = 0;
  }
  else {
    iVar2 = -1;
    if ((char)*len_00 == '+') {
      iVar2 = 1;
    }
    acc = (int *)((long)len_00 + 1);
    str_00 = (char **)(lit + -1);
    iVar3 = match_digits(acc,str_00,(size_t *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         (date_parse_string *)CONCAT44(iVar1,iVar2));
    if ((iVar3 == 0) &&
       ((iVar1 == 0 ||
        (iVar3 = match_digits(acc,str_00,(size_t *)in_stack_ffffffffffffffc8,
                              in_stack_ffffffffffffffc0,(date_parse_string *)CONCAT44(iVar1,iVar2)),
        iVar3 == 0)))) {
      local_4 = 0;
    }
    else {
      if ((str_00 == (char **)0x0) || ((char)*acc != ':')) {
        match_digits(acc,str_00,(size_t *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (date_parse_string *)CONCAT44(iVar1,iVar2));
      }
      else {
        acc = (int *)((long)acc + 1);
        str_00 = (char **)((long)str_00 + -1);
        iVar3 = match_digits(acc,str_00,(size_t *)in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc0,(date_parse_string *)CONCAT44(iVar1,iVar2));
        if (iVar3 == 0) {
          return 0;
        }
      }
      if ((str_00 == (char **)0x0) || ((char)*acc != ':')) {
        match_digits(acc,str_00,(size_t *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (date_parse_string *)CONCAT44(iVar1,iVar2));
      }
      else {
        acc = (int *)((long)acc + 1);
        str_00 = (char **)((long)str_00 + -1);
        iVar1 = match_digits(acc,str_00,(size_t *)in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc0,(date_parse_string *)CONCAT44(iVar1,iVar2));
        if (iVar1 == 0) {
          return 0;
        }
      }
      pCVar4 = CVmTimeZoneCache::get_gmtofs_zone(in_stack_00000088,in_stack_00000084);
      *(CVmTimeZone **)(in_RDI + 0x38) = pCVar4;
      *(int *)(in_RDI + 0x40) = iVar2 * local_4c * 0xe10 * 1000;
      *(long *)(in_RDI + 0x108) = *in_RSI;
      *(long *)(in_RDI + 0x110) = (long)acc - *in_RSI;
      *in_RSI = (long)acc;
      *in_RDX = (char *)str_00;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int match_tzofs(VMG_ date_parse_result *res,
                       const char *&str, size_t &len)
{
    const char *p = str;
    size_t rem = len;

    /* first, skip "gmt" if present */
    date_parse_string part;
    int gmtlit = match_lit(p, rem, "^GMT", part);

    /* get the sign */
    if (rem == 0 || (*p != '+' && *p != '-'))
        return FALSE;
    int s = (*p == '+' ? 1 : -1);

    /* skip the sign */
    ++p, --rem;

    /* 
     *   Get the "hh".  If the "GMT" literal was present, allow a single
     *   digit; otherwise require the two-digit format. 
     */
    int hh;
    if (!match_digits(hh, p, rem, "0509", part)
        && (!gmtlit || !match_digits(hh, p, rem, "09", part)))
        return FALSE;

    /* 
     *   check for ":" - if present, the minutes must be present, otherwise
     *   they're optional 
     */
    int mi = 0;
    if (rem != 0 && *p == ':')
    {
        /* skip the ":", then require the minutes */
        ++p, --rem;
        if (!match_digits(mi, p, rem, "0509", part))
            return FALSE;
    }
    else
    {
        /* no ":", so the minuts are optional */
        match_digits(mi, p, rem, "0509", part);
    }

    /* likewise, check for ":ss" */
    int ss = 0;
    if (rem != 0 && *p == ':')
    {
        ++p, --rem;
        if (!match_digits(ss, p, rem, "0509", part))
            return FALSE;
    }
    else
    {
        match_digits(ss, p, rem, "0509", part);
    }

    /* success - figure the offset in seconds */
    int32_t ofs = s * ((hh*60*60) + (mi*60) + ss);

    /* look up the zone by offset */
    res->tz = G_tzcache->get_gmtofs_zone(vmg_ ofs);

    /* also set the explicit offset value (in milliseconds) */
    res->tzofs = ofs * 1000;

    /* set the capture data */
    res->ptz.p = str;
    res->ptz.len = p - str;

    /* advance the caller's vars past the parsed tzofs and return success */
    str = p;
    len = rem;
    return TRUE;
}